

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmModule * CompileVm(ExpressionContext *ctx,ExprBase *expression,char *code)

{
  FunctionData *pFVar1;
  SynBase *pSVar2;
  ScopeData *scope;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  VmFunction *pVVar5;
  VariableData **ppVVar6;
  TypeBase **ppTVar7;
  FunctionData **ppFVar8;
  undefined4 extraout_var_01;
  ExprBase **ppEVar9;
  VmBlock *block;
  InplaceStr *pIVar10;
  uint i;
  uint i_1;
  uint k_1;
  uint uVar11;
  SmallArray<FunctionData_*,_128U> *this_00;
  ExprBase *pEVar12;
  uint k;
  uint uVar13;
  VmType VVar14;
  VariableData *variable;
  TraceScope traceScope;
  VariableData *local_88;
  IntrusiveList<VmFunction> *local_80;
  VmFunction *local_78;
  SmallArray<FunctionData_*,_128U> *local_70;
  TypeBase *local_68;
  undefined8 local_60;
  Allocator *local_58;
  VmType local_50;
  TraceScope local_40;
  VmModule *this;
  undefined4 extraout_var_00;
  
  if (CompileVm(ExpressionContext&,ExprBase*,char_const*)::token == '\0') {
    iVar4 = __cxa_guard_acquire(&CompileVm(ExpressionContext&,ExprBase*,char_const*)::token);
    if (iVar4 != 0) {
      CompileVm::token = NULLC::TraceGetToken("InstructionTreeVm","CompileVm");
      __cxa_guard_release(&CompileVm(ExpressionContext&,ExprBase*,char_const*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_40,CompileVm::token);
  if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x38)) {
    this = (VmModule *)0x0;
  }
  else {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x15c0);
    this = (VmModule *)CONCAT44(extraout_var,iVar4);
    VmModule::VmModule(this,ctx->allocator,code);
    iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x170);
    pVVar5 = (VmFunction *)CONCAT44(extraout_var_00,iVar4);
    VmFunction::VmFunction
              (pVVar5,this->allocator,(VmType)ZEXT816(0),expression->source,(FunctionData *)0x0,
               (ScopeData *)expression[1]._vptr_ExprBase,(VmType)ZEXT816(0));
    for (uVar13 = 0; uVar13 < (pVVar5->scope->allVariables).count; uVar13 = uVar13 + 1) {
      ppVVar6 = SmallArray<VariableData_*,_4U>::operator[](&pVVar5->scope->allVariables,uVar13);
      local_88 = *ppVVar6;
      if (local_88->isAlloca == true) {
        SmallArray<VariableData_*,_4U>::push_back(&pVVar5->allocas,&local_88);
      }
    }
    local_78 = pVVar5;
    for (uVar13 = 0; uVar13 < (ctx->types).count; uVar13 = uVar13 + 1) {
      ppTVar7 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,uVar13);
      (*ppTVar7)->typeIndex = uVar13;
    }
    this_00 = &ctx->functions;
    local_80 = &this->functions;
    local_70 = this_00;
    for (uVar13 = 0; uVar11 = (ctx->functions).count, uVar13 < uVar11; uVar13 = uVar13 + 1) {
      ppFVar8 = SmallArray<FunctionData_*,_128U>::operator[](this_00,uVar13);
      pFVar1 = *ppFVar8;
      bVar3 = ExpressionContext::IsGenericFunction(ctx,pFVar1);
      if ((!bVar3) &&
         (((pFVar1->isPrototype != true || (pFVar1->implementation == (FunctionData *)0x0)) &&
          (pFVar1->vmFunction == (VmFunction *)0x0)))) {
        iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x170);
        pVVar5 = (VmFunction *)CONCAT44(extraout_var_01,iVar4);
        local_58 = this->allocator;
        VVar14 = GetVmType(ctx,ctx->typeFunctionID);
        local_68 = VVar14.structType;
        local_60 = VVar14._0_8_;
        pSVar2 = pFVar1->source;
        scope = pFVar1->functionScope;
        local_50 = GetVmType(ctx,pFVar1->type->returnType);
        VVar14.structType = local_68;
        VVar14.type = (undefined4)local_60;
        VVar14.size = local_60._4_4_;
        VmFunction::VmFunction(pVVar5,local_58,VVar14,pSVar2,pFVar1,scope,local_50);
        for (uVar11 = 0; uVar11 < (pVVar5->scope->allVariables).count; uVar11 = uVar11 + 1) {
          ppVVar6 = SmallArray<VariableData_*,_4U>::operator[](&pVVar5->scope->allVariables,uVar11);
          local_88 = *ppVVar6;
          if (local_88->isAlloca == true) {
            SmallArray<VariableData_*,_4U>::push_back(&pVVar5->allocas,&local_88);
          }
        }
        pFVar1->vmFunction = pVVar5;
        IntrusiveList<VmFunction>::push_back(local_80,pVVar5);
        this_00 = local_70;
      }
    }
    for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
      ppFVar8 = SmallArray<FunctionData_*,_128U>::operator[](this_00,uVar13);
      pFVar1 = *ppFVar8;
      if ((pFVar1->isPrototype == true) && (pFVar1->implementation != (FunctionData *)0x0)) {
        pFVar1->vmFunction = pFVar1->implementation->vmFunction;
      }
      uVar11 = (ctx->functions).count;
    }
    for (uVar13 = 0; pVVar5 = local_78, uVar13 < *(uint *)&expression[1].source; uVar13 = uVar13 + 1
        ) {
      ppEVar9 = SmallArray<ExprBase_*,_32U>::operator[]
                          ((SmallArray<ExprBase_*,_32U> *)&expression[1].typeID,uVar13);
      CompileVm(ctx,this,*ppEVar9);
    }
    this->skipFunctionDefinitions = true;
    this->currentFunction = local_78;
    block = anon_unknown.dwarf_11cad6::CreateBlock(this,expression->source,"start");
    VmFunction::AddBlock(pVVar5,block);
    this->currentBlock = block;
    VmValue::AddUse(&block->super_VmValue,&pVVar5->super_VmValue);
    for (pEVar12 = expression + 7; pEVar12 = (ExprBase *)pEVar12->_vptr_ExprBase,
        pEVar12 != (ExprBase *)0x0; pEVar12 = (ExprBase *)&pEVar12->next) {
      CompileVm(ctx,this,pEVar12);
    }
    pIVar10 = (InplaceStr *)&expression[7].source;
    while (pSVar2 = (SynBase *)pIVar10->begin, pSVar2 != (SynBase *)0x0) {
      CompileVm(ctx,this,(ExprBase *)pSVar2);
      pIVar10 = &pSVar2->pos;
    }
    IntrusiveList<VmFunction>::push_back(local_80,pVVar5);
    this->currentFunction = (VmFunction *)0x0;
    this->currentBlock = (VmBlock *)0x0;
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return this;
}

Assistant:

VmModule* CompileVm(ExpressionContext &ctx, ExprBase *expression, const char *code)
{
	TRACE_SCOPE("InstructionTreeVm", "CompileVm");

	if(ExprModule *node = getType<ExprModule>(expression))
	{
		VmModule *module = new (ctx.get<VmModule>()) VmModule(ctx.allocator, code);

		// Generate global function
		VmFunction *global = new (module->get<VmFunction>()) VmFunction(module->allocator, VmType::Void, node->source, NULL, node->moduleScope, VmType::Void);

		for(unsigned k = 0; k < global->scope->allVariables.size(); k++)
		{
			VariableData *variable = global->scope->allVariables[k];

			if(variable->isAlloca)
				global->allocas.push_back(variable);
		}

		// Generate type indexes
		for(unsigned i = 0; i < ctx.types.size(); i++)
			ctx.types[i]->typeIndex = i;

		// Generate VmFunction object for each function
		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			if(ctx.IsGenericFunction(function))
				continue;

			// Skip prototypes that will have an implementation later
			if(function->isPrototype && function->implementation)
				continue;

			if(function->vmFunction)
				continue;

			VmFunction *vmFunction = new (module->get<VmFunction>()) VmFunction(module->allocator, GetVmType(ctx, ctx.typeFunctionID), function->source, function, function->functionScope, GetVmType(ctx, function->type->returnType));

			for(unsigned k = 0; k < vmFunction->scope->allVariables.size(); k++)
			{
				VariableData *variable = vmFunction->scope->allVariables[k];

				if(variable->isAlloca)
					vmFunction->allocas.push_back(variable);
			}

			function->vmFunction = vmFunction;

			module->functions.push_back(vmFunction);
		}

		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			if(function->isPrototype && function->implementation)
				function->vmFunction = function->implementation->vmFunction;
		}

		for(unsigned i = 0; i < node->definitions.size(); i++)
			CompileVm(ctx, module, node->definitions[i]);

		module->skipFunctionDefinitions = true;

		// Setup global function
		module->currentFunction = global;

		VmBlock *block = CreateBlock(module, node->source, "start");

		global->AddBlock(block);
		module->currentBlock = block;
		block->AddUse(global);

		for(ExprBase *value = node->setup.head; value; value = value->next)
			CompileVm(ctx, module, value);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			CompileVm(ctx, module, value);

		module->functions.push_back(global);

		module->currentFunction = NULL;
		module->currentBlock = NULL;

		return module;
	}

	return NULL;
}